

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdcpp.hpp
# Opt level: O3

unique_ptr<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>,_std::default_delete<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>_>_>
 __thiscall
so_5::stdcpp::
make_unique<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>>,so_5::outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>>>
          (stdcpp *this,
          outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>_>
          *args)

{
  default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>
  *pdVar1;
  disp_binder_t *this_00;
  
  this_00 = (disp_binder_t *)operator_new(0x10);
  pdVar1 = args->m_ptr;
  disp_binder_t::disp_binder_t(this_00);
  *(disp_binder_t **)this = this_00;
  this_00->_vptr_disp_binder_t = (_func_int **)&PTR__disp_binder_t_002876c8;
  this_00[1]._vptr_disp_binder_t = (_func_int **)pdVar1;
  return (__uniq_ptr_data<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>,_std::default_delete<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>_>,_true,_true>
          )(__uniq_ptr_data<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>,_std::default_delete<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr< T >
make_unique( ARGS && ...args )
	{
		return std::unique_ptr< T >( new T( std::forward<ARGS>(args)... ) );
	}